

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryOptimizer.cpp
# Opt level: O0

Query * reorder_subqueries(Query *q)

{
  QueryType *pQVar1;
  iterator __last;
  iterator __comp;
  __normal_iterator<Query_*,_std::vector<Query,_std::allocator<Query>_>_> in_RSI;
  Query *in_RDI;
  Query *in_stack_ffffffffffffffc8;
  Query *this;
  Query *in_stack_ffffffffffffffe0;
  
  this = in_RDI;
  pQVar1 = Query::get_type(in_RSI._M_current);
  if (*pQVar1 == AND) {
    Query::as_queries(in_stack_ffffffffffffffe0);
    __last = std::vector<Query,_std::allocator<Query>_>::begin(in_stack_ffffffffffffffc8);
    Query::as_queries(in_stack_ffffffffffffffe0);
    __comp = std::vector<Query,_std::allocator<Query>_>::end(in_stack_ffffffffffffffc8);
    std::
    stable_sort<__gnu_cxx::__normal_iterator<Query*,std::vector<Query,std::allocator<Query>>>,bool(*)(Query_const&,Query_const&)>
              (in_RSI,(__normal_iterator<Query_*,_std::vector<Query,_std::allocator<Query>_>_>)
                      __last._M_current,(_func_bool_Query_ptr_Query_ptr *)__comp._M_current);
  }
  Query::Query(this,in_stack_ffffffffffffffc8);
  return in_RDI;
}

Assistant:

Query reorder_subqueries(Query &&q) {
    if (q.get_type() == QueryType::AND) {
        std::stable_sort(q.as_queries().begin(), q.as_queries().end(),
                         query_heuristic_comparer);
    }
    return std::move(q);  // Currently only support AND operators.
}